

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals2
          (SPxSolverBase<double> *this,double leaveMax,SPxId enterId,double *enterBound,
          double *newUBbound,double *newLBbound,double *newCoPrhs,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  Status SVar5;
  pointer pdVar6;
  VectorBase<double> *pVVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  Status *pSVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  DataKey local_58;
  long local_50;
  undefined1 local_48 [16];
  DataKey local_38;
  
  this_00 = &this->super_SPxBasisBase<double>;
  *enterBound = 0.0;
  local_38 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    switch((this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11]) {
    case D_FREE:
      pVVar7 = &this->theURbound;
      if (leaveMax *
          (this->thePvec->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] < 0.0) {
        pVVar7 = &this->theLRbound;
      }
      *newCoPrhs = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *newUBbound = dVar1;
      ::soplex::infinity::__tls_init();
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      *newLBbound = -dVar1;
      goto LAB_001c0e87;
    case D_ON_UPPER:
      goto switchD_001c08c1_caseD_2;
    case D_ON_LOWER:
code_r0x001c0b6c:
      ::soplex::infinity::__tls_init();
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      *newUBbound = *(double *)(in_FS_OFFSET + -8);
      *newLBbound = 0.0;
      pSVar10[lVar11] = P_ON_UPPER;
      pdVar6 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001c0c58;
    case D_ON_BOTH:
      if (0.0 <= leaveMax *
                 (this->thePvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11]) goto code_r0x001c0b6c;
      goto switchD_001c08c1_caseD_2;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE54 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR! Tried to put a fixed row variable into the basis: ",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", lhs=",6);
      poVar8 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", rhs=",6);
      poVar8 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::endl<char,std::char_traits<char>>(poVar8);
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE05 This should never happen.","");
      *puVar9 = &PTR__SPxException_0069d438;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE06 This should never happen.","");
      *puVar9 = &PTR__SPxException_0069d438;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = SVar5;
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar14 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      if (dVar1 < *(double *)(in_FS_OFFSET + -8)) {
        (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = dVar14;
      }
      *newCoPrhs = dVar14;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      uVar3 = *(uint *)((long)pdVar6 + 4);
      *(undefined4 *)newLBbound = *(undefined4 *)pdVar6;
      *(uint *)((long)newLBbound + 4) = uVar3 ^ 0x80000000;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar3 = *(uint *)((long)(pdVar6 + lVar11) + 4);
      *(undefined4 *)newUBbound = *(undefined4 *)(pdVar6 + lVar11);
      *(uint *)((long)newUBbound + 4) = uVar3 ^ 0x80000000;
      break;
    case P_ON_UPPER:
      SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = SVar5;
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar14 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      if (-*(double *)(in_FS_OFFSET + -8) < dVar1) {
        (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = dVar14;
      }
      *newCoPrhs = dVar14;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      uVar3 = *(uint *)((long)pdVar6 + 4);
      *(undefined4 *)newUBbound = *(undefined4 *)pdVar6;
      *(uint *)((long)newUBbound + 4) = uVar3 ^ 0x80000000;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar3 = *(uint *)((long)(pdVar6 + lVar11) + 4);
      *(undefined4 *)newLBbound = *(undefined4 *)(pdVar6 + lVar11);
      *(uint *)((long)newLBbound + 4) = uVar3 ^ 0x80000000;
      break;
    case P_FREE:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE04 This should never happen.","");
      *puVar9 = &PTR__SPxException_0069d438;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *enterBound = -pdVar6[lVar11];
    dVar1 = objChange->sum;
    dVar14 = dVar1 - *newCoPrhs * pdVar6[lVar11];
    objChange->c = (-(*newCoPrhs * pdVar6[lVar11]) - (dVar14 - dVar1)) +
                   (dVar1 - (dVar14 - (dVar14 - dVar1))) + objChange->c;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    switch((this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11]) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *newUBbound = dVar1;
      ::soplex::infinity::__tls_init();
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      *newLBbound = -dVar1;
      *newCoPrhs = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
LAB_001c0e87:
      pSVar10[lVar11] = P_FIXED;
      return;
    case D_ON_LOWER:
code_r0x001c0c1f:
      ::soplex::infinity::__tls_init();
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      *newUBbound = *(double *)(in_FS_OFFSET + -8);
      *newLBbound = 0.0;
      pSVar10[lVar11] = P_ON_UPPER;
      pdVar6 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001c0c58;
    case D_ON_BOTH:
      if (0.0 <= leaveMax *
                 (this->theCoPvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11]) goto code_r0x001c0c1f;
    case D_ON_UPPER:
      *newUBbound = 0.0;
      ::soplex::infinity::__tls_init();
      pSVar10 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      *newLBbound = -*(double *)(in_FS_OFFSET + -8);
      pSVar10[lVar11] = P_ON_LOWER;
      pdVar6 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_001c0c58:
      *newCoPrhs = pdVar6[lVar11];
      return;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE56 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR! Tried to put a fixed column variable into the basis. ",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", lower=",8);
      poVar8 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", upper=",8);
      poVar8 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::endl<char,std::char_traits<char>>(poVar8);
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE07 This should never happen.","");
      *puVar9 = &PTR__SPxException_0069d438;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE08 This should never happen.","");
      *puVar9 = &PTR__SPxException_0069d438;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar14 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      if (dVar1 < *(double *)(in_FS_OFFSET + -8)) {
        (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = dVar14;
      }
      *newCoPrhs = dVar14;
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      uVar12 = SUB84(dVar1,0);
      uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
      *newLBbound = dVar1;
      break;
    case P_ON_UPPER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar14 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      if (-*(double *)(in_FS_OFFSET + -8) < dVar1) {
        (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = dVar14;
      }
      *newCoPrhs = dVar14;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *newUBbound = pdVar6[lVar11];
      *newLBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      dVar1 = pdVar6[lVar11];
      uVar12 = SUB84(dVar1,0);
      uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
      break;
    case P_FREE:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      pVVar7 = &this->theLCbound;
      if (0.0 < leaveMax *
                (this->thePvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar11]) {
        pVVar7 = &this->theUCbound;
      }
      *newCoPrhs = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      *newLBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      *enterBound = 0.0;
      return;
    }
    *enterBound = (double)CONCAT44(uVar13,uVar12);
    dVar2 = (double)CONCAT44(uVar13,uVar12) * *newCoPrhs;
    dVar1 = objChange->sum;
    dVar14 = dVar1 - dVar2;
    objChange->c = (-dVar2 - (dVar14 - dVar1)) + (dVar1 - (dVar14 - (dVar14 - dVar1))) +
                   objChange->c;
  }
  objChange->sum = dVar14;
  return;
switchD_001c08c1_caseD_2:
  *newUBbound = 0.0;
  ::soplex::infinity::__tls_init();
  pSVar10 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
  *newLBbound = -*(double *)(in_FS_OFFSET + -8);
  pSVar10[lVar11] = P_ON_LOWER;
  pdVar6 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  goto LAB_001c0c58;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}